

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O0

void dgemv(char trans,int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
          double *y,int incy)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  allocator<char> local_99;
  string local_98;
  double local_78;
  double temp;
  int local_68;
  int leny;
  int lenx;
  int ky;
  int kx;
  int jy;
  int jx;
  int j;
  int iy;
  int ix;
  int info;
  int i;
  double beta_local;
  double *x_local;
  double *pdStack_28;
  int lda_local;
  double *a_local;
  double alpha_local;
  int local_10;
  int n_local;
  int m_local;
  char trans_local;
  
  iy = 0;
  _info = beta;
  beta_local = (double)x;
  x_local._4_4_ = lda;
  pdStack_28 = a;
  a_local = (double *)alpha;
  alpha_local._4_4_ = n;
  local_10 = m;
  n_local._3_1_ = trans;
  bVar3 = lsame(trans,'N');
  if (((bVar3) || (bVar3 = lsame(n_local._3_1_,'T'), bVar3)) ||
     (bVar3 = lsame(n_local._3_1_,'C'), bVar3)) {
    iVar2 = x_local._4_4_;
    if (local_10 < 0) {
      iy = 2;
    }
    else if (alpha_local._4_4_ < 0) {
      iy = 3;
    }
    else {
      iVar4 = i4_max(1,local_10);
      if (iVar2 < iVar4) {
        iy = 6;
      }
      else if (incx == 0) {
        iy = 8;
      }
      else if (incy == 0) {
        iy = 0xb;
      }
    }
  }
  else {
    iy = 1;
  }
  if (iy == 0) {
    if (((local_10 != 0) && (alpha_local._4_4_ != 0)) &&
       ((((double)a_local != 0.0 || ((NAN((double)a_local) || (_info != 1.0)))) || (NAN(_info))))) {
      bVar3 = lsame(n_local._3_1_,'N');
      if (bVar3) {
        local_68 = alpha_local._4_4_;
        temp._4_4_ = local_10;
      }
      else {
        local_68 = local_10;
        temp._4_4_ = alpha_local._4_4_;
      }
      if (incx < 1) {
        lenx = -((local_68 + -1) * incx);
      }
      else {
        lenx = 0;
      }
      if (incy < 1) {
        leny = -((temp._4_4_ + -1) * incy);
      }
      else {
        leny = 0;
      }
      if ((_info != 1.0) || (NAN(_info))) {
        if (incy == 1) {
          if ((_info != 0.0) || (NAN(_info))) {
            for (ix = 0; ix < temp._4_4_; ix = ix + 1) {
              y[ix] = _info * y[ix];
            }
          }
          else {
            for (ix = 0; ix < temp._4_4_; ix = ix + 1) {
              y[ix] = 0.0;
            }
          }
        }
        else {
          jx = leny;
          if ((_info != 0.0) || (NAN(_info))) {
            for (ix = 0; ix < temp._4_4_; ix = ix + 1) {
              y[jx] = _info * y[jx];
              jx = jx + incy;
            }
          }
          else {
            for (ix = 0; ix < temp._4_4_; ix = ix + 1) {
              y[jx] = 0.0;
              jx = jx + incy;
            }
          }
        }
      }
      if (((double)a_local != 0.0) || (NAN((double)a_local))) {
        bVar3 = lsame(n_local._3_1_,'N');
        if (bVar3) {
          kx = lenx;
          if (incy == 1) {
            for (jy = 0; jy < alpha_local._4_4_; jy = jy + 1) {
              dVar1 = *(double *)((long)beta_local + (long)kx * 8);
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                dVar1 = *(double *)((long)beta_local + (long)kx * 8);
                for (ix = 0; ix < local_10; ix = ix + 1) {
                  y[ix] = (double)a_local * dVar1 * pdStack_28[ix + jy * x_local._4_4_] + y[ix];
                }
              }
              kx = kx + incx;
            }
          }
          else {
            for (jy = 0; jy < alpha_local._4_4_; jy = jy + 1) {
              dVar1 = *(double *)((long)beta_local + (long)kx * 8);
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                dVar1 = *(double *)((long)beta_local + (long)kx * 8);
                jx = leny;
                for (ix = 0; ix < local_10; ix = ix + 1) {
                  y[jx] = (double)a_local * dVar1 * pdStack_28[ix + jy * x_local._4_4_] + y[jx];
                  jx = jx + incy;
                }
              }
              kx = kx + incx;
            }
          }
        }
        else {
          ky = leny;
          if (incx == 1) {
            for (jy = 0; jy < alpha_local._4_4_; jy = jy + 1) {
              local_78 = 0.0;
              for (ix = 0; ix < local_10; ix = ix + 1) {
                local_78 = pdStack_28[ix + jy * x_local._4_4_] *
                           *(double *)((long)beta_local + (long)ix * 8) + local_78;
              }
              y[ky] = (double)a_local * local_78 + y[ky];
              ky = ky + incy;
            }
          }
          else {
            for (jy = 0; jy < alpha_local._4_4_; jy = jy + 1) {
              local_78 = 0.0;
              j = lenx;
              for (ix = 0; ix < local_10; ix = ix + 1) {
                local_78 = pdStack_28[ix + jy * x_local._4_4_] *
                           *(double *)((long)beta_local + (long)j * 8) + local_78;
                j = j + incx;
              }
              y[ky] = (double)a_local * local_78 + y[ky];
              ky = ky + incy;
            }
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"DGEMV",&local_99);
    xerbla(&local_98,iy);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  return;
}

Assistant:

void dgemv ( char trans, int m, int n, double alpha, double a[], int lda, 
  double x[], int incx, double beta, double y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DGEMV computes y := alpha * A * x + beta * y for general matrix A.
//
//  Discussion:
//
//    DGEMV performs one of the matrix-vector operations
//      y := alpha*A *x + beta*y
//    or
//      y := alpha*A'*x + beta*y,
//    where alpha and beta are scalars, x and y are vectors and A is an
//    m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 April 2014
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Parameters:
//
//    Input, char TRANS, specifies the operation to be performed:
//    'n' or 'N'   y := alpha*A *x + beta*y.
//    't' or 'T'   y := alpha*A'*x + beta*y.
//    'c' or 'C'   y := alpha*A'*x + beta*y.
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier for A * x.
//
//    Input, double A[LDA*N].  The M x N subarray contains
//    the matrix A.
//
//    Input, int LDA, the the first dimension of A as declared
//    in the calling routine.  max ( 1, M ) <= LDA.
//
//    Input, double X[*], an array containing the vector to be 
//    multiplied by the matrix A.  
//    If TRANS = 'N' or 'n', then X must contain N entries, stored in INCX 
//    increments in a space of at least ( 1 + ( N - 1 ) * abs ( INCX ) ) 
//    locations.
//    Otherwise, X must contain M entries, store in INCX increments
//    in a space of at least ( 1 + ( M - 1 ) * abs ( INCX ) ) locations.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
//    Input, double BETA, the scalar multiplier for Y.
//
//    Input/output, double Y[*], an array containing the vector to
//    be scaled and incremented by A*X.
//    If TRANS = 'N' or 'n', then Y must contain M entries, stored in INCY
//    increments in a space of at least ( 1 + ( M - 1 ) * abs ( INCY ) ) 
//    locations.
//    Otherwise, Y must contain N entries, store in INCY increments
//    in a space of at least ( 1 + ( N - 1 ) * abs ( INCY ) ) locations.
//
//    Input, int INCY, the increment for the elements of
//    Y.  INCY must not be zero.
//
{
  int i;
  int info;
  int ix;
  int iy;
  int j;
  int jx;
  int jy;
  int kx;
  int ky;
  int lenx;
  int leny;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( ! lsame ( trans, 'N' ) &&
       ! lsame ( trans, 'T' ) &&
       ! lsame ( trans, 'C' ) ) 
  {
    info = 1;
  }
  else if ( m < 0 )
  {
    info = 2;
  }
  else if ( n < 0 )
  {
    info = 3;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }
  else if ( incy == 0 )
  {
    info = 11;
  }

  if ( info != 0 )
  {
    xerbla ( "DGEMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( ( m == 0 ) ||
       ( n == 0 ) ||
       ( ( alpha == 0.0 ) && ( beta == 1.0 ) ) )
 {
   return;
  }
//
//  Set LENX and LENY, the lengths of the vectors x and y, and set
//  up the start points in X and Y.
//
  if ( lsame ( trans, 'N' ) )
  {
    lenx = n;
    leny = m;
  }
  else
  {
    lenx = m;
    leny = n;
  }

  if ( 0 < incx )
  {
    kx = 0;
  }
  else
  {
    kx = 0 - ( lenx - 1 ) * incx;
  }

  if ( 0 < incy )
  {
    ky = 0;
  }
  else
  {
    ky = 0 - ( leny - 1 ) * incy;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
//  First form  y := beta*y.
//
  if ( beta != 1.0 )
  {
    if ( incy == 1 )
    {
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = 0.0;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = beta * y[i];
        }
      }
    }
    else
    {
      iy = ky;
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = 0.0;
          iy = iy + incy;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = beta * y[iy];
          iy = iy + incy;
        }
      }
    }
  }

  if ( alpha == 0.0 )
  {
    return;
  }
//
//  Form y := alpha*A*x + y.
//
  if ( lsame ( trans, 'N' ) )
  {
    jx = kx;
    if ( incy == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          for ( i = 0; i < m; i++ )
          {
            y[i] = y[i] + temp * a[i+j*lda];
          }
        }
        jx = jx + incx;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          iy = ky;
          for ( i = 0; i < m; i++ )
          {
            y[iy] = y[iy] + temp * a[i+j*lda];
            iy = iy + incy;
          }
        }
        jx = jx + incx;
      }
    }
  }
/*
  Form y := alpha*A'*x + y.
*/
  else
  {
    jy = ky;
    if ( incx == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[i];
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[ix];
          ix = ix + incx;
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
  }

  return;
}